

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

SExpression __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::GetValueAtIteration
          (LoopPeelingInfo *this,SERecurrentNode *rec,int64_t iteration)

{
  SExpression SVar1;
  SExpression offset;
  SExpression coeff;
  SExpression local_48;
  SExpression local_38;
  SExpression local_28;
  
  SExpression::SExpression(&local_28,rec->coefficient_);
  SExpression::SExpression(&local_38,rec->offset_);
  local_48 = SExpression::operator*<long,_0>(&local_28,iteration);
  SVar1 = SExpression::operator+(&local_48,local_38.node_);
  return SVar1;
}

Assistant:

SExpression LoopPeelingPass::LoopPeelingInfo::GetValueAtIteration(
    SERecurrentNode* rec, int64_t iteration) const {
  SExpression coeff = rec->GetCoefficient();
  SExpression offset = rec->GetOffset();

  return (coeff * iteration) + offset;
}